

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall IMLE::clusterForwardSolutions(IMLE *this,int newSol1,int newSol2,int worseSol)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  pointer pFVar5;
  pointer pMVar6;
  pointer pMVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  Index IVar11;
  undefined8 *puVar12;
  long lVar13;
  ActualDstType actualDst;
  double **ppdVar14;
  int iVar15;
  undefined4 in_register_00000034;
  long lVar16;
  Index index;
  long lVar17;
  ulong uVar18;
  double *pdVar19;
  Index index_1;
  ulong uVar20;
  long lVar21;
  long lVar22;
  Index othersize;
  pointer pMVar23;
  Scalar SVar24;
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  X dist;
  Mat p;
  Mat sol;
  ArrayX sumInvRxj;
  ArrayX sumInvRj;
  Mat local_148;
  scalar_sum_op<double,_double> local_129;
  DenseStorage<double,__1,__1,__1,_0> local_128;
  DenseStorage<double,__1,__1,__1,_0> local_108;
  Mat *local_e8;
  IMLE *local_e0;
  Scal local_d8;
  undefined8 uStack_d0;
  Mat *local_c8;
  ulong local_c0;
  long local_b8;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
  local_b0;
  undefined1 local_80 [32];
  Mat *local_60;
  variable_if_dynamic<long,__1> local_58;
  variable_if_dynamic<long,__1> local_50;
  Mat *local_48;
  RhsNested local_40;
  
  local_128.m_data = (double *)0x0;
  local_128.m_rows = 0;
  local_128.m_cols = 0;
  lVar17 = (long)this->M;
  lVar13 = (long)this->nSolFound;
  if ((lVar13 != 0 && lVar17 != 0) &&
     (auVar26 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar26 / SEXT816(lVar13),0) < lVar17)) {
    puVar12 = (undefined8 *)
              __cxa_allocate_exception
                        (8,CONCAT44(in_register_00000034,newSol1),
                         SUB168(auVar26 % SEXT816(lVar13),0));
    *puVar12 = operator_delete;
    __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_128,lVar13 * lVar17,lVar17,lVar13);
  local_108.m_data = (double *)0x0;
  local_108.m_rows = 0;
  local_108.m_cols = 0;
  lVar17 = (long)this->D;
  lVar13 = (long)this->nSolFound;
  if ((lVar13 != 0 && lVar17 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar13),0) < lVar17)) {
    puVar12 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar12 = operator_delete;
    __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_108,lVar13 * lVar17,lVar17,lVar13);
  if (1 < this->nSolFound) {
    lVar13 = 0;
    lVar17 = 0;
    do {
      uVar18 = local_108.m_rows;
      if ((((ulong)(local_108.m_data + local_108.m_rows * lVar17) & 7) == 0) &&
         (uVar18 = (ulong)((uint)((ulong)(local_108.m_data + local_108.m_rows * lVar17) >> 3) & 1),
         local_108.m_rows <= (long)uVar18)) {
        uVar18 = local_108.m_rows;
      }
      lVar22 = (long)(this->predictions).
                     super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar17].
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      ;
      if (0 < (long)uVar18) {
        uVar20 = 0;
        do {
          *(undefined8 *)((long)local_108.m_data + uVar20 * 8 + local_108.m_rows * lVar13) =
               *(undefined8 *)(lVar22 + uVar20 * 8);
          uVar20 = uVar20 + 1;
        } while (uVar18 != uVar20);
      }
      lVar21 = local_108.m_rows - uVar18;
      uVar20 = (lVar21 - (lVar21 >> 0x3f) & 0xfffffffffffffffeU) + uVar18;
      if (1 < lVar21) {
        do {
          puVar12 = (undefined8 *)(lVar22 + uVar18 * 8);
          uVar8 = puVar12[1];
          puVar1 = (undefined8 *)((long)local_108.m_data + uVar18 * 8 + local_108.m_rows * lVar13);
          *puVar1 = *puVar12;
          puVar1[1] = uVar8;
          uVar18 = uVar18 + 2;
        } while ((long)uVar18 < (long)uVar20);
      }
      if ((long)uVar20 < local_108.m_rows) {
        do {
          *(undefined8 *)((long)local_108.m_data + uVar20 * 8 + local_108.m_rows * lVar13) =
               *(undefined8 *)(lVar22 + uVar20 * 8);
          uVar20 = uVar20 + 1;
        } while (local_108.m_rows != uVar20);
      }
      lVar17 = lVar17 + 1;
      lVar13 = lVar13 + 8;
    } while (lVar17 < (long)this->nSolFound + -1);
  }
  pdVar19 = local_108.m_data + worseSol * local_108.m_rows;
  uVar18 = local_108.m_rows;
  if ((((ulong)pdVar19 & 7) == 0) &&
     (uVar18 = (ulong)((uint)((ulong)pdVar19 >> 3) & 1), local_108.m_rows <= (long)uVar18)) {
    uVar18 = local_108.m_rows;
  }
  lVar13 = *(long *)&(this->experts).
                     super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     .
                     super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     ._M_impl.super__Vector_impl_data._M_start[newSol1].super_LinearExpert.pred_x.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  lVar17 = local_108.m_rows - uVar18;
  if (0 < (long)uVar18) {
    uVar20 = 0;
    do {
      pdVar19[uVar20] = *(double *)(lVar13 + uVar20 * 8);
      uVar20 = uVar20 + 1;
    } while (uVar18 != uVar20);
  }
  uVar20 = (lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU) + uVar18;
  if (1 < lVar17) {
    do {
      pdVar2 = (double *)(lVar13 + uVar18 * 8);
      dVar25 = pdVar2[1];
      pdVar19[uVar18] = *pdVar2;
      (pdVar19 + uVar18)[1] = dVar25;
      uVar18 = uVar18 + 2;
    } while ((long)uVar18 < (long)uVar20);
  }
  if ((long)uVar20 < local_108.m_rows) {
    do {
      pdVar19[uVar20] = *(double *)(lVar13 + uVar20 * 8);
      uVar20 = uVar20 + 1;
    } while (local_108.m_rows != uVar20);
  }
  pdVar19 = local_108.m_data + ((long)this->nSolFound + -1) * local_108.m_rows;
  uVar18 = local_108.m_rows;
  if ((((ulong)pdVar19 & 7) == 0) &&
     (uVar18 = (ulong)((uint)((ulong)pdVar19 >> 3) & 1), local_108.m_rows <= (long)uVar18)) {
    uVar18 = local_108.m_rows;
  }
  lVar13 = *(long *)&(this->experts).
                     super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     .
                     super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     ._M_impl.super__Vector_impl_data._M_start[newSol2].super_LinearExpert.pred_x.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  lVar17 = local_108.m_rows - uVar18;
  if (0 < (long)uVar18) {
    uVar20 = 0;
    do {
      pdVar19[uVar20] = *(double *)(lVar13 + uVar20 * 8);
      uVar20 = uVar20 + 1;
    } while (uVar18 != uVar20);
  }
  uVar20 = (lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU) + uVar18;
  if (1 < lVar17) {
    do {
      pdVar2 = (double *)(lVar13 + uVar18 * 8);
      dVar25 = pdVar2[1];
      pdVar19[uVar18] = *pdVar2;
      (pdVar19 + uVar18)[1] = dVar25;
      uVar18 = uVar18 + 2;
    } while ((long)uVar18 < (long)uVar20);
  }
  if ((long)uVar20 < local_108.m_rows) {
    do {
      pdVar19[uVar20] = *(double *)(lVar13 + uVar20 * 8);
      uVar20 = uVar20 + 1;
    } while (local_108.m_rows != uVar20);
  }
  local_e0 = this;
  if (0 < (this->param).iterMax) {
    local_e8 = &this->fInvRj;
    local_c8 = &this->invRxj;
    uVar18 = 0;
    do {
      local_c0 = uVar18;
      if (0 < this->M) {
        lVar17 = 0;
        lVar13 = 0;
        do {
          local_b8 = lVar17;
          if (0 < this->nSolFound) {
            local_d8 = (Scal)(lVar13 * 0x308);
            lVar22 = 0;
            lVar17 = 0;
            do {
              IVar11 = local_108.m_rows;
              pdVar19 = local_108.m_data;
              pFVar5 = (this->experts).
                       super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                       .
                       super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data = (double *)0x0;
              local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows = 0;
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_148,
                         local_108.m_rows,1);
              lVar21 = *(long *)((long)&(pFVar5->super_LinearExpert).pred_x + (long)local_d8);
              uVar18 = IVar11;
              if (local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows != IVar11) {
                Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                          ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_148,
                           IVar11,1);
                uVar18 = local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_rows;
              }
              this = local_e0;
              uVar20 = uVar18 - ((long)uVar18 >> 0x3f) & 0xfffffffffffffffe;
              if (1 < (long)uVar18) {
                lVar16 = 0;
                do {
                  pdVar2 = (double *)(lVar21 + lVar16 * 8);
                  dVar25 = pdVar2[1];
                  pdVar3 = (double *)((long)pdVar19 + lVar16 * 8 + IVar11 * lVar22);
                  dVar27 = pdVar3[1];
                  local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data[lVar16] = *pdVar2 - *pdVar3;
                  (local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data + lVar16)[1] = dVar25 - dVar27;
                  lVar16 = lVar16 + 2;
                } while (lVar16 < (long)uVar20);
              }
              if ((long)uVar20 < (long)uVar18) {
                do {
                  local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data[uVar20] =
                       *(double *)(lVar21 + uVar20 * 8) -
                       *(double *)((long)pdVar19 + uVar20 * 8 + IVar11 * lVar22);
                  uVar20 = uVar20 + 1;
                } while (uVar18 != uVar20);
              }
              local_80._16_8_ =
                   (local_e0->fInvRj).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
              ;
              local_80._8_8_ =
                   (local_e0->fInvRj).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
                   + local_80._16_8_ * lVar13;
              local_60 = local_e8;
              local_58.m_value = 0;
              dVar25 = -0.0;
              local_80._0_8_ = &local_148;
              local_50.m_value = lVar13;
              local_48 = (Mat *)local_80._16_8_;
              local_40 = (RhsNested)&local_148;
              if ((Mat *)local_80._16_8_ != (Mat *)0x0) {
                local_b0.
                super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
                .
                super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
                m_d.data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                           (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                           local_148.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data;
                local_b0.
                super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
                .
                super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                .m_d.rhsImpl.
                super_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
                .
                super_product_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_7,_Eigen::DiagonalShape,_Eigen::DenseShape,_double,_double>
                .
                super_diagonal_product_evaluator_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_1>
                .m_matImpl.
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
                m_d.data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            )(evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              )local_148.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_data;
                local_b0.
                super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
                .
                super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                .m_d.rhsImpl.
                super_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
                .
                super_product_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_7,_Eigen::DiagonalShape,_Eigen::DenseShape,_double,_double>
                .
                super_diagonal_product_evaluator_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_1>
                .m_diagImpl.
                super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                .super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
                super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                .m_data = (PointerType)local_80._8_8_;
                local_b0.
                super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
                .
                super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                .m_d.rhsImpl.
                super_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
                .
                super_product_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_7,_Eigen::DiagonalShape,_Eigen::DenseShape,_double,_double>
                .
                super_diagonal_product_evaluator_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_1>
                .m_diagImpl.
                super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                .super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
                super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                .m_outerStride.m_value = local_80._16_8_;
                local_80._0_8_ = &local_148;
                local_40 = (RhsNested)&local_148;
                SVar24 = Eigen::internal::
                         redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>,Eigen::Matrix<double,-1,1,0,-1,1>,1>const>>,3,0>
                         ::
                         run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>,Eigen::Matrix<double,_1,1,0,_1,1>,1>const>>
                                   (&local_b0,&local_129,
                                    (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
                                     *)local_80);
                dVar25 = SVar24 * -0.5;
              }
              dVar25 = exp(dVar25);
              local_128.m_data[local_128.m_rows * lVar17 + lVar13] = dVar25;
              free(local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              lVar17 = lVar17 + 1;
              lVar22 = lVar22 + 8;
            } while (lVar17 < this->nSolFound);
          }
          if (local_128.m_cols != 0) {
            dVar25 = local_128.m_data[lVar13];
            if (1 < local_128.m_cols) {
              lVar17 = local_128.m_cols + -1;
              pdVar19 = (double *)(local_b8 + local_128.m_rows * 8 + (long)local_128.m_data);
              do {
                dVar25 = dVar25 + *pdVar19;
                pdVar19 = pdVar19 + local_128.m_rows;
                lVar17 = lVar17 + -1;
              } while (lVar17 != 0);
            }
            if (0 < local_128.m_cols && 0.0 < dVar25) {
              pdVar19 = (double *)((long)local_128.m_data + local_b8);
              IVar11 = local_128.m_cols;
              do {
                *pdVar19 = *pdVar19 / dVar25;
                pdVar19 = pdVar19 + local_128.m_rows;
                IVar11 = IVar11 + -1;
              } while (IVar11 != 0);
            }
          }
          lVar13 = lVar13 + 1;
          lVar17 = local_b8 + 8;
        } while (lVar13 < this->M);
      }
      local_80._0_8_ = local_c8;
      local_80._8_8_ = &local_128;
      local_80._16_8_ = local_e8;
      local_80._24_8_ = local_80._8_8_;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_108,
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                  *)local_80,(assign_op<double,_double> *)&local_b0);
      uVar10 = (int)local_c0 + 1;
      uVar18 = (ulong)uVar10;
    } while ((int)uVar10 < (this->param).iterMax);
  }
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)local_80,(long)this->nSolFound,&this->zeroX,(allocator_type *)&local_b0);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)&local_b0,(long)this->nSolFound,&this->zeroX,(allocator_type *)&local_148);
  iVar15 = this->nSolFound;
  lVar13 = (long)iVar15;
  if ((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != lVar13) {
    free((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    if (iVar15 < 1) {
      pdVar19 = (double *)0x0;
    }
    else {
      pdVar19 = (double *)malloc(lVar13 * 8);
      if (pdVar19 == (double *)0x0) {
        puVar12 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar12 = operator_delete;
        __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = pdVar19;
  }
  (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       lVar13;
  if (0 < iVar15) {
    memset((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data,0,lVar13 << 3);
  }
  if (0 < this->M) {
    lVar13 = 0;
    lVar17 = 0;
    do {
      if (local_128.m_cols == 0) {
        iVar15 = -1;
      }
      else if (local_128.m_cols < 2) {
        iVar15 = 0;
      }
      else {
        pdVar19 = (double *)(lVar13 + local_128.m_rows * 8 + (long)local_128.m_data);
        lVar21 = 1;
        lVar22 = 0;
        dVar25 = local_128.m_data[lVar17];
        do {
          dVar27 = *pdVar19;
          if (dVar25 < dVar27) {
            lVar22 = lVar21;
          }
          iVar15 = (int)lVar22;
          if (dVar27 <= dVar25) {
            dVar27 = dVar25;
          }
          lVar21 = lVar21 + 1;
          pdVar19 = pdVar19 + local_128.m_rows;
          dVar25 = dVar27;
        } while (local_128.m_cols != lVar21);
      }
      (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar17] = iVar15;
      pdVar19 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      lVar21 = (long)iVar15;
      pdVar19[lVar21] =
           (this->experts).
           super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
           super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar17].super_LinearExpert.p_z_T +
           pdVar19[lVar21];
      pdVar19 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar22 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      pdVar2 = (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_80._0_8_)->
                 m_storage).m_data)[lVar21 * 2];
      uVar18 = (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_80._0_8_)->
                 m_storage).m_rows)[lVar21 * 2];
      uVar20 = uVar18 - ((long)uVar18 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar18) {
        lVar21 = 0;
        do {
          pdVar3 = (double *)((long)pdVar19 + lVar21 * 8 + lVar22 * lVar13);
          dVar27 = pdVar3[1];
          dVar25 = (pdVar2 + lVar21)[1];
          pdVar2[lVar21] = *pdVar3 + pdVar2[lVar21];
          (pdVar2 + lVar21)[1] = dVar27 + dVar25;
          lVar21 = lVar21 + 2;
        } while (lVar21 < (long)uVar20);
      }
      if ((long)uVar20 < (long)uVar18) {
        do {
          pdVar2[uVar20] =
               *(double *)((long)pdVar19 + uVar20 * 8 + lVar22 * lVar13) + pdVar2[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar18 != uVar20);
      }
      pdVar19 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar22 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      lVar16 = (long)(this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar17];
      lVar21 = *(long *)(local_b0.
                         super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
                         .
                         super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                         .m_d._0_8_ + lVar16 * 0x10);
      uVar18 = *(ulong *)(local_b0.
                          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
                          .
                          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                          .m_d._0_8_ + lVar16 * 0x10 + 8);
      uVar20 = uVar18 - ((long)uVar18 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar18) {
        lVar16 = 0;
        do {
          pdVar2 = (double *)((long)pdVar19 + lVar16 * 8 + lVar22 * lVar13);
          dVar27 = pdVar2[1];
          pdVar3 = (double *)(lVar21 + lVar16 * 8);
          dVar25 = pdVar3[1];
          pdVar4 = (double *)(lVar21 + lVar16 * 8);
          *pdVar4 = *pdVar2 + *pdVar3;
          pdVar4[1] = dVar27 + dVar25;
          lVar16 = lVar16 + 2;
        } while (lVar16 < (long)uVar20);
      }
      if ((long)uVar20 < (long)uVar18) {
        do {
          *(double *)(lVar21 + uVar20 * 8) =
               *(double *)((long)pdVar19 + uVar20 * 8 + lVar22 * lVar13) +
               *(double *)(lVar21 + uVar20 * 8);
          uVar20 = uVar20 + 1;
        } while (uVar18 != uVar20);
      }
      lVar17 = lVar17 + 1;
      lVar13 = lVar13 + 8;
    } while (lVar17 < this->M);
  }
  uVar18 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  local_d8 = this->pNoiseModelZ;
  uStack_d0 = 0;
  pdVar19 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data;
  if ((this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar18) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar18,1
              );
    uVar18 = (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
  }
  pdVar2 = (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar20 = uVar18 - ((long)uVar18 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar18) {
    lVar13 = 0;
    do {
      pdVar3 = pdVar19 + lVar13;
      dVar25 = pdVar3[1];
      pdVar4 = pdVar2 + lVar13;
      *pdVar4 = *pdVar3 + local_d8;
      pdVar4[1] = dVar25 + local_d8;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar20);
  }
  if ((long)uVar20 < (long)uVar18) {
    do {
      pdVar2[uVar20] = pdVar19[uVar20] + local_d8;
      uVar20 = uVar20 + 1;
    } while (uVar18 != uVar20);
  }
  pMVar6 = (this->predictions).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar7 = (this->predictions).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar23 = pMVar6;
  if (pMVar7 != pMVar6) {
    do {
      free((pMVar23->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data);
      pMVar23 = pMVar23 + 1;
    } while (pMVar23 != pMVar7);
    (this->predictions).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar6;
  }
  if (0 < this->nSolFound) {
    lVar13 = 0;
    do {
      uVar9 = local_80._0_8_;
      uVar8 = local_b0.
              super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
              .
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_d._0_8_;
      local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_148,
                 (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_80._0_8_)->
                   m_storage).m_rows)[lVar13 * 2],1);
      ppdVar14 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)uVar9)->m_storage)
                  .m_data + lVar13 * 2;
      lVar17 = *(long *)(uVar8 + lVar13 * 0x10);
      pdVar19 = *ppdVar14;
      uVar18 = (ulong)ppdVar14[1];
      if (local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows != uVar18) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_148,uVar18,1);
        uVar18 = local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
      }
      uVar20 = uVar18 - ((long)uVar18 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar18) {
        lVar22 = 0;
        do {
          auVar26 = divpd(*(undefined1 (*) [16])(lVar17 + lVar22 * 8),
                          *(undefined1 (*) [16])(pdVar19 + lVar22));
          *(undefined1 (*) [16])
           (local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data + lVar22) = auVar26;
          lVar22 = lVar22 + 2;
        } while (lVar22 < (long)uVar20);
      }
      if ((long)uVar20 < (long)uVar18) {
        do {
          local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data[uVar20] = *(double *)(lVar17 + uVar20 * 8) / pdVar19[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar18 != uVar20);
      }
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back(&this->predictions,(value_type *)&local_148);
      free(local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      lVar13 = lVar13 + 1;
    } while (lVar13 < local_e0->nSolFound);
  }
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)&local_b0);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)local_80);
  free(local_108.m_data);
  free(local_128.m_data);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::clusterForwardSolutions(int newSol1, int newSol2, int worseSol)
{
    Mat p(M,nSolFound);
    Mat sol(D,nSolFound);

    // "Educated" guesses for the nSolFound solutions
    for(int k = 0; k < nSolFound-1; k++)
        sol.col(k) = predictions[k];
    // Split worse solution in two
    sol.col(worseSol)    = experts[newSol1].getPredX();
    sol.col(nSolFound-1) = experts[newSol2].getPredX();

    for( int nIter = 0; nIter < param.iterMax; nIter++ )
    {
        // E-Step
        for( int j = 0; j < M; j++ )
        {
            for( int k = 0; k < nSolFound; k++ )
            {
                X dist = experts[j].getPredX() - sol.col(k);
                p(j,k) = exp(-0.5*dist.dot(fInvRj.col(j).asDiagonal()*dist));
            }
            Scal pSum;
            if( (pSum = p.row(j).sum()) > 0.0 )
                p.row(j) /= pSum;
        }
        // M-Step
        sol = (invRxj * p).cwiseQuotient( fInvRj * p );
        /* Here I can easily implement k-means by hard assigning to most probable solution */
    }


    /***** Recalculate (hard-assign) solutions   ******/
    // Aux variables
    ArrayX sumInvRj(nSolFound, zeroX);
    ArrayX sumInvRxj(nSolFound, zeroX);

    sum_p_z.setZero(nSolFound);

    // Hard assign solutions
    for( int j = 0; j < M; j++ )
    {
        p.row(j).maxCoeff(&sNearest[j]);

        sum_p_z(sNearest[j]) += experts[j].get_p_z();
        sumInvRj[sNearest[j]] += fInvRj.col(j);
        sumInvRxj[sNearest[j]] += invRxj.col(j);
    }
    sumW = sum_p_z.array() + pNoiseModelZ;

    // Clear predict data structure
    predictions.clear();

    // Update storage results
    for( int k = 0; k < nSolFound; k++ )
        predictions.push_back( sumInvRxj[k].cwiseQuotient(sumInvRj[k]) );
}